

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_oper.cpp
# Opt level: O0

void __thiscall FParser::OPor_bin(FParser *this,svalue_t *result,int start,int n,int stop)

{
  uint uVar1;
  uint uVar2;
  undefined1 local_58 [8];
  svalue_t right;
  svalue_t left;
  int stop_local;
  int n_local;
  int start_local;
  svalue_t *result_local;
  FParser *this_local;
  
  svalue_t::svalue_t((svalue_t *)&right.value);
  svalue_t::svalue_t((svalue_t *)local_58);
  EvaluateExpression(this,(svalue_t *)&right.value,start,n + -1);
  EvaluateExpression(this,(svalue_t *)local_58,n + 1,stop);
  result->type = 1;
  uVar1 = intvalue((svalue_t *)&right.value);
  uVar2 = intvalue((svalue_t *)local_58);
  (result->value).i = uVar1 | uVar2;
  svalue_t::~svalue_t((svalue_t *)local_58);
  svalue_t::~svalue_t((svalue_t *)&right.value);
  return;
}

Assistant:

void FParser::OPor_bin(svalue_t &result, int start, int n, int stop)
{
	svalue_t left, right;
	
	evaluate_leftnright(start, n, stop);
	
	result.type = svt_int;
	result.value.i = intvalue(left) | intvalue(right);
}